

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O0

void __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ProcessMOIterationUnpostsolvedSolution
          (MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ModelValuesDbl *sol)

{
  bool bVar1;
  vector<double,_std::allocator<double>_> *this_00;
  size_type sVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *this_01;
  QuadraticObjective *in_RSI;
  MOManager<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double dVar4;
  int i;
  vector<double,_std::allocator<double>_> *xx;
  vector<double,_std::allocator<double>_> *objs;
  ValueMap<std::vector<double,_std::allocator<double>_>,_int> *in_stack_00000080;
  double in_stack_ffffffffffffffb8;
  int i_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  int iVar6;
  
  bVar1 = IsMOActive(in_RDI);
  if (bVar1) {
    pre::ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::
    GetObjValues((ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>
                  *)in_RSI);
    this_00 = pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
                        (in_stack_00000080);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
    if (sVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::front
                         ((vector<double,_std::allocator<double>_> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      in_RDI->objval_last_ = *pvVar3;
    }
    pre::ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>::
    GetVarValues((ModelValues<mp::pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>_>
                  *)in_RSI);
    this_01 = pre::ValueMap<std::vector<double,_std::allocator<double>_>,_int>::operator()
                        (in_stack_00000080);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(this_01);
    if (sVar2 != 0) {
      FlatModel<mp::DefaultFlatModelParams>::num_objs
                ((FlatModel<mp::DefaultFlatModelParams> *)0x17f79e);
      std::vector<double,_std::allocator<double>_>::resize
                (this_01,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      iVar5 = 0;
      while( true ) {
        i_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
        iVar6 = iVar5;
        sVar2 = std::vector<double,_std::allocator<double>_>::size(this_00);
        if ((int)sVar2 <= iVar5) break;
        FlatModel<mp::DefaultFlatModelParams>::get_obj
                  ((FlatModel<mp::DefaultFlatModelParams> *)
                   CONCAT44(iVar5,in_stack_ffffffffffffffc0),i_00);
        in_stack_ffffffffffffffb8 =
             ComputeValue<std::vector<double,std::allocator<double>>>(in_RSI,this_00);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar6);
        *pvVar3 = in_stack_ffffffffffffffb8;
        iVar5 = iVar6 + 1;
      }
      std::vector<mp::QuadraticObjective,_std::allocator<mp::QuadraticObjective>_>::operator[]
                (&in_RDI->obj_new_,(long)(in_RDI->i_current_obj_ + -1));
      dVar4 = ComputeValue<std::vector<double,std::allocator<double>>>(in_RSI,this_00);
      in_RDI->objval_last_ = dVar4;
    }
  }
  return;
}

Assistant:

void ProcessMOIterationUnpostsolvedSolution(pre::ModelValuesDbl& sol) {
    if (IsMOActive()) {
      auto& objs = sol.GetObjValues()();
      if (objs.size())
        objval_last_ = objs.front();           // 0. save emulated obj value
      // @todo 1. check if the solver correctly reports the current emulated obj
      // 2. Let's recompute the original objectives
      // and the last iteration's objective, TODO: if needed
      const auto& xx = sol.GetVarValues()();
      if (xx.size()) {                         // This can be invoked w/o solution
        objs.resize( MPCD(num_objs()) );
        for (int i=0; i<(int)objs.size(); ++i)
          objs[i] = ComputeValue(MPCD(get_obj(i)), xx);
        objval_last_ = ComputeValue(obj_new_[i_current_obj_-1], xx);
      }
    }
  }